

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_1::createRandomCaseGroup
               (TestCaseGroup *parentGroup,Context *context,char *groupName,char *description,
               BufferMode bufferMode,deUint32 features,int numCases,deUint32 baseSeed)

{
  int iVar1;
  TestNode *node;
  SSBOLayoutCase *this;
  int local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  int local_58;
  BufferMode local_54;
  string local_50;
  
  local_54 = bufferMode;
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,context->m_testCtx,groupName,description);
  tcu::TestNode::addChild(&parentGroup->super_TestNode,node);
  local_58 = tcu::CommandLine::getBaseSeed(context->m_testCtx->m_cmdLine);
  local_58 = local_58 + baseSeed;
  local_5c = (int)(features << 0x1a) >> 0x1f & 3;
  local_60 = features * 2 & 8;
  local_64 = features >> 2 & 2;
  local_68 = 0;
  while( true ) {
    if (numCases <= local_68) break;
    this = (SSBOLayoutCase *)operator_new(0xe0);
    de::toString<int>(&local_50,&local_68);
    iVar1 = local_68;
    SSBOLayoutCase::SSBOLayoutCase
              (this,context->m_testCtx,context->m_renderCtx,local_50._M_dataplus._M_p,
               glcts::fixed_sample_locations_values + 1,GLSL_VERSION_310_ES,local_54);
    (this->super_TestCase).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SSBOLayoutCase_01e4beb8;
    *(deUint32 *)&this[1].super_TestCase.super_TestNode._vptr_TestNode = features;
    *(undefined4 *)((long)&this[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 4;
    *(uint *)&this[1].super_TestCase.super_TestNode.m_testCtx = local_5c;
    *(uint *)((long)&this[1].super_TestCase.super_TestNode.m_testCtx + 4) = local_60;
    *(uint *)&this[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = local_64;
    *(undefined8 *)((long)&this[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) =
         0x400000005;
    *(int *)((long)&this[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) =
         iVar1 + local_58;
    this[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity =
         (size_type)&DAT_100000001;
    *(undefined4 *)((long)&this[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 1;
    tcu::TestNode::addChild(node,(TestNode *)this);
    std::__cxx11::string::~string((string *)&local_50);
    local_68 = local_68 + 1;
  }
  return;
}

Assistant:

static void createRandomCaseGroup (tcu::TestCaseGroup* parentGroup, Context& context, const char* groupName, const char* description, SSBOLayoutCase::BufferMode bufferMode, deUint32 features, int numCases, deUint32 baseSeed)
{
	tcu::TestCaseGroup* group = new tcu::TestCaseGroup(context.getTestContext(), groupName, description);
	parentGroup->addChild(group);

	baseSeed += (deUint32)context.getTestContext().getCommandLine().getBaseSeed();

	for (int ndx = 0; ndx < numCases; ndx++)
		group->addChild(new RandomSSBOLayoutCase(context, de::toString(ndx).c_str(), "", bufferMode, features, (deUint32)ndx+baseSeed));
}